

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

uint __thiscall Memory::LargeHeapBlock::GetMarkCount(LargeHeapBlock *this)

{
  Recycler *pRVar1;
  _func_int **pp_Var2;
  bool bVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  
  pRVar1 = this->heapInfo->recycler;
  uVar5 = 0;
  for (uVar4 = 0; uVar4 < this->allocCount; uVar4 = uVar4 + 1) {
    pp_Var2 = (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4];
    if ((pp_Var2 != (_func_int **)0x0) && (uVar4 == *(uint *)pp_Var2)) {
      bVar3 = HeapBlockMap64::IsMarked(&pRVar1->heapBlockMap,pp_Var2 + 4);
      uVar5 = uVar5 + bVar3;
    }
  }
  return uVar5;
}

Assistant:

uint
LargeHeapBlock::GetMarkCount()
{
    uint markCount = 0;
    const HeapBlockMap& heapBlockMap = this->heapInfo->recycler->heapBlockMap;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader* header = this->HeaderList()[i];
        if (header && header->objectIndex == i && heapBlockMap.IsMarked(header->GetAddress()))
        {
            markCount++;
        }
    }

    return markCount;
}